

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_135799e::ResizeTest_TestExternalResizeWorks4Threads_Test::TestBody
          (ResizeTest_TestExternalResizeWorks4Threads_Test *this)

{
  EncoderTest *pEVar1;
  pointer pFVar2;
  bool bVar3;
  SEARCH_METHODS *pSVar4;
  pointer pFVar5;
  AssertHelper local_a0;
  AssertHelper local_98;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  uint expected_h;
  uint expected_w;
  ResizingVideoSource video;
  
  ResizingVideoSource::ResizingVideoSource(&video,0x280,0x1e0);
  video.super_DummyVideoSource._44_4_ = 0;
  video.random_input_one_half_only_ = true;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_ResizeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x280;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x1e0;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_threads = 4;
  (this->super_ResizeTest).super_EncoderTest.cfg_.kf_min_dist = 0x28;
  (this->super_ResizeTest).super_EncoderTest.cfg_.kf_max_dist = 0x28;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar3 = testing::internal::AlwaysTrue();
    if (bVar3) {
      pEVar1 = &(this->super_ResizeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar3 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar3 == false) {
      local_a0.data_ =
           (AssertHelperData *)
           ((long)(this->super_ResizeTest).frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_ResizeTest).frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
      local_98.data_._0_4_ = video.super_DummyVideoSource.limit_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&gtest_fatal_failure_checker,"frame_info_list_.size()","video.limit()",
                 (unsigned_long *)&local_a0,(uint *)&local_98);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar4 = "";
        }
        else {
          pSVar4 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x14d,(char *)pSVar4);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        pFVar2 = (this->super_ResizeTest).frame_info_list_.
                 super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pFVar5 = (this->super_ResizeTest).frame_info_list_.
                      super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar2;
            pFVar5 = pFVar5 + 1) {
          ScaleForFrameNumber((uint)pFVar5->pts,0x280,0x1e0,video.super_DummyVideoSource._44_4_,
                              false,video.random_input_one_half_only_,&expected_w,&expected_h);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_fatal_failure_checker,"expected_w","info.w",&expected_w,
                     &pFVar5->w);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_a0);
            std::operator<<((ostream *)&(local_a0.data_)->line,"Frame ");
            std::ostream::_M_insert<unsigned_long>((ulong)&(local_a0.data_)->line);
            std::operator<<((ostream *)&(local_a0.data_)->line," had unexpected width");
            pSVar4 = "";
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
              pSVar4 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                       ,0x156,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if (local_a0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                    ((internal *)&gtest_fatal_failure_checker,"expected_h","info.h",&expected_h,
                     &pFVar5->h);
          if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                    _vptr_TestPartResultReporterInterface == '\0') {
            testing::Message::Message((Message *)&local_a0);
            std::operator<<((ostream *)&(local_a0.data_)->line,"Frame ");
            std::ostream::_M_insert<unsigned_long>((ulong)&(local_a0.data_)->line);
            std::operator<<((ostream *)&(local_a0.data_)->line," had unexpected height");
            pSVar4 = "";
            if ((undefined8 *)
                CONCAT71(gtest_fatal_failure_checker._9_7_,
                         gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0) {
              pSVar4 = *(SEARCH_METHODS **)
                        CONCAT71(gtest_fatal_failure_checker._9_7_,
                                 gtest_fatal_failure_checker.has_new_fatal_failure_);
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                       ,0x158,(char *)pSVar4);
            testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
            testing::internal::AssertHelper::~AssertHelper(&local_98);
            if (local_a0.data_ != (AssertHelperData *)0x0) {
              (**(code **)(*(long *)local_a0.data_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
      }
      goto LAB_005eb0c7;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x149,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_005eb0c7:
  libaom_test::DummyVideoSource::~DummyVideoSource(&video.super_DummyVideoSource);
  return;
}

Assistant:

TEST_P(ResizeTest, TestExternalResizeWorks4Threads) {
  ResizingVideoSource video(640, 480);
  video.flag_codec_ = 0;
  video.random_input_one_half_only_ = true;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_forced_max_frame_width = 640;
  cfg_.g_forced_max_frame_height = 480;
  cfg_.g_threads = 4;
  cfg_.kf_max_dist = 40;
  cfg_.kf_min_dist = 40;
  cfg_.rc_dropframe_thresh = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());

  for (const auto &info : frame_info_list_) {
    const unsigned int frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w;
    unsigned int expected_h;
    ScaleForFrameNumber(frame, 640, 480, video.flag_codec_, false,
                        video.random_input_one_half_only_, &expected_w,
                        &expected_h);
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
  }
#endif
}